

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O1

shared_handle __thiscall
gmlc::libguarded::cow_guarded<int,std::timed_mutex>::
try_lock_shared_until<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
          (cow_guarded<int,std::timed_mutex> *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *timepoint)

{
  int *piVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *puVar2;
  ulong uVar3;
  shared_handle sVar4;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  uVar3 = (ulong)((byte)~*(byte *)((long)&timepoint[4].__d.__r + 1) & 1);
  LOCK();
  piVar1 = (int *)((long)&timepoint[4].__d.__r + uVar3 * 4 + 4);
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  puVar2 = (undefined8 *)
           ((long)&(timepoint->__d).__r + (ulong)(((byte)~(byte)timepoint[4].__d.__r & 1) << 4));
  *(undefined8 *)this = *puVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1));
  LOCK();
  piVar1 = (int *)((long)&timepoint[4].__d.__r + uVar3 * 4 + 4);
  *piVar1 = *piVar1 + -1;
  UNLOCK();
  sVar4.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_handle)sVar4.super___shared_ptr<const_int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto cow_guarded<T, M>::try_lock_shared_until(const TimePoint& timepoint) const
    -> shared_handle
{
    shared_handle retval;

    auto slock = m_data.try_lock_shared_until(timepoint);
    if (slock) {
        retval = *slock;
    }

    return retval;
}